

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalGenerator::ClearGeneratorMembers(cmGlobalGenerator *this)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  cmLocalGenerator *pcVar5;
  pointer *__ptr;
  pointer puVar6;
  pointer this_00;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
  ::clear(&(this->BuildExportSets)._M_t);
  puVar1 = (this->Makefiles).
           super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->Makefiles).
           super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = puVar1;
  if (puVar2 != puVar1) {
    do {
      std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != puVar2);
    (this->Makefiles).
    super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  puVar3 = (this->LocalGenerators).
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->LocalGenerators).
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar6 = puVar3;
  if (puVar4 != puVar3) {
    do {
      pcVar5 = (puVar6->_M_t).
               super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
               super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
               super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
      if (pcVar5 != (cmLocalGenerator *)0x0) {
        (*pcVar5->_vptr_cmLocalGenerator[1])();
      }
      (puVar6->_M_t).super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
      ._M_t.super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
      super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl = (cmLocalGenerator *)0x0;
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar4);
    (this->LocalGenerators).
    super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar3;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->AliasTargets)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
           *)&this->ExportSets);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->InstallComponents)._M_t);
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_cmTargetDependSet>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_cmTargetDependSet>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmTargetDependSet>_>_>
  ::clear(&(this->TargetDependencies)._M_t);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->TargetSearchIndex)._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->GeneratorTargetSearchIndex)._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefile_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefile_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->MakefileSearchIndex)._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->LocalGeneratorSearchIndex)._M_h);
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_long>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
  ::clear(&(this->TargetOrderIndex)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  ::clear(&(this->ProjectMap)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>_>
  ::clear(&(this->RuleHashes)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::DirectoryContent>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::DirectoryContent>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::DirectoryContent>_>_>
  ::clear(&(this->DirectoryContentMap)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->BinaryDirectories)._M_t);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear(&(this->GeneratedFiles)._M_h);
  return;
}

Assistant:

void cmGlobalGenerator::ClearGeneratorMembers()
{
  this->BuildExportSets.clear();

  this->Makefiles.clear();

  this->LocalGenerators.clear();

  this->AliasTargets.clear();
  this->ExportSets.clear();
  this->InstallComponents.clear();
  this->TargetDependencies.clear();
  this->TargetSearchIndex.clear();
  this->GeneratorTargetSearchIndex.clear();
  this->MakefileSearchIndex.clear();
  this->LocalGeneratorSearchIndex.clear();
  this->TargetOrderIndex.clear();
  this->ProjectMap.clear();
  this->RuleHashes.clear();
  this->DirectoryContentMap.clear();
  this->BinaryDirectories.clear();
  this->GeneratedFiles.clear();
}